

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O3

ReadFileResult anon_unknown.dwarf_111ea1d::VariableValueHelper(string *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  char *pcVar3;
  Value *local_18;
  
  if (value == (Value *)0x0) {
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
    RVar2 = READ_OK;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      bVar1 = Json::Value::asBool(value);
      pcVar3 = "FALSE";
      if (bVar1) {
        pcVar3 = "TRUE";
      }
      RVar2 = READ_OK;
      std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,(ulong)pcVar3);
    }
    else {
      local_18 = value;
      if ((anonymous_namespace)::VariableStringHelper_abi_cxx11_._16_8_ == 0) {
        std::__throw_bad_function_call();
      }
      RVar2 = (*(code *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_._24_8_)
                        ((anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,&local_18);
    }
  }
  return RVar2;
}

Assistant:

ReadFileResult VariableValueHelper(std::string& out, const Json::Value* value)
{
  if (!value) {
    out.clear();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return ReadFileResult::READ_OK;
  }

  return VariableStringHelper(out, value);
}